

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::EarlyFragmentTestsCase::iterate
          (EarlyFragmentTestsCase *this)

{
  ostringstream *this_00;
  RenderTargetType RVar1;
  Functional *this_01;
  TestLog *log;
  deUint32 dVar2;
  GLenum GVar3;
  ContextType type;
  GLSLVersion version;
  Functions *gl;
  int *piVar4;
  long lVar5;
  TypedObjectWrapper<(glu::ObjectType)3> *this_02;
  TypedObjectWrapper<(glu::ObjectType)2> *pTVar6;
  ProgramSources *pPVar7;
  TestError *this_03;
  RenderTargetType RVar8;
  int iVar9;
  Surface *surface;
  RenderContext *renderContext;
  void *__buf;
  int iVar10;
  char *pcVar11;
  bool bVar12;
  CallLogWrapper glLog;
  GLint local_47c;
  GLint local_478;
  allocator<char> local_471;
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  testAttachment;
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  colorAttachment;
  Surface rendered;
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  fbo;
  Texture texture;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  string glslVersionDeclaration;
  Random rnd;
  UniformAccessLogger uniforms;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  string local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  LayeredImage src;
  GLuint local_1f0;
  bool local_1c8;
  VertexArrayBinding attrBindings [1];
  
  this_01 = (Functional *)((this->super_TestCase).m_context)->m_renderCtx;
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  gl = (Functions *)(**(code **)(*(long *)this_01 + 0x18))(this_01);
  glu::CallLogWrapper::CallLogWrapper(&glLog,gl,log);
  dVar2 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deRandom_init(&rnd.m_rnd,dVar2);
  RVar1 = this->m_renderTarget;
  bVar12 = this->m_useEarlyTests;
  local_478 = 0;
  local_47c = 0;
  if (RVar1 == RENDERTARGET_DEFAULT) {
    piVar4 = (int *)(**(code **)(*(long *)this_01 + 0x20))(this_01);
    local_47c = 0;
    local_478 = de::Random::getInt(&rnd,0,*piVar4 + -0x20);
    if (this->m_renderTarget == RENDERTARGET_DEFAULT) {
      lVar5 = (**(code **)(*(long *)this_01 + 0x20))(this_01);
      local_47c = de::Random::getInt(&rnd,0,*(int *)(lVar5 + 4) + -0x20);
    }
  }
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper(&texture,(RenderContext *)this_01)
  ;
  fbo.
  super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  .m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)3> *)0x0;
  colorAttachment.
  super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  .m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)2> *)0x0;
  testAttachment.
  super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  .m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)2> *)0x0;
  glLog.m_enableLog = true;
  this_00 = (ostringstream *)(src.m_size.m_data + 1);
  src._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"// Created a texture (name ");
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::operator<<((ostream *)this_00,")");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&src,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  glu::CallLogWrapper::glActiveTexture(&glLog,0x84c0);
  glu::CallLogWrapper::glBindTexture(&glLog,0xde1,texture.super_ObjectWrapper.m_object);
  setTexParameteri(&glLog,0xde1);
  attrBindings[0].binding.type = TYPE_LOCATION;
  attrBindings[0].binding._4_4_ = 0x21;
  LayeredImage::LayeredImage(&src,TEXTURETYPE_2D,(TextureFormat *)attrBindings,1,1,1);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)attrBindings,0);
  Functional::(anonymous_namespace)::LayeredImage::setPixel<tcu::Vector<int,4>>
            ((LayeredImage *)&src,0,0,0,(Vector<int,_4> *)attrBindings);
  uploadTexture(&glLog,&src,0);
  LayeredImage::~LayeredImage(&src);
  glu::CallLogWrapper::glBindImageTexture
            (&glLog,0,texture.super_ObjectWrapper.m_object,0,'\x01',0,0x88ba,0x8236);
  lVar5 = (**(code **)(*(long *)this_01 + 0x18))(this_01);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glBindImageTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                  ,0xba3);
  if (this->m_renderTarget - RENDERTARGET_FBO < 2) {
    this_02 = (TypedObjectWrapper<(glu::ObjectType)3> *)operator_new(0x18);
    glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
              (this_02,(RenderContext *)this_01);
    src.m_type = TEXTURETYPE_2D;
    src.m_size.m_data[0] = 0;
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
    ::assignData(&fbo.
                  super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                 ,(PtrData<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                   )glLog._0_16_);
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
    ::~UniqueBase((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                   *)&src);
    pTVar6 = (TypedObjectWrapper<(glu::ObjectType)2> *)operator_new(0x18);
    glu::TypedObjectWrapper<(glu::ObjectType)2>::TypedObjectWrapper(pTVar6,(RenderContext *)this_01)
    ;
    src.m_type = TEXTURETYPE_2D;
    src.m_size.m_data[0] = 0;
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
    ::assignData(&colorAttachment.
                  super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                 ,(PtrData<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                   )glLog._0_16_);
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
    ::~UniqueBase((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                   *)&src);
    pTVar6 = (TypedObjectWrapper<(glu::ObjectType)2> *)operator_new(0x18);
    glu::TypedObjectWrapper<(glu::ObjectType)2>::TypedObjectWrapper(pTVar6,(RenderContext *)this_01)
    ;
    src.m_type = TEXTURETYPE_2D;
    src.m_size.m_data[0] = 0;
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
    ::assignData(&testAttachment.
                  super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                 ,(PtrData<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                   )glLog._0_16_);
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
    ::~UniqueBase((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                   *)&src);
    glu::CallLogWrapper::glBindRenderbuffer
              (&glLog,0x8d41,
               ((colorAttachment.
                 super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                 .m_data.ptr)->super_ObjectWrapper).m_object);
    glu::CallLogWrapper::glRenderbufferStorage(&glLog,0x8d41,0x8058,0x20,0x20);
    lVar5 = (**(code **)(*(long *)this_01 + 0x18))(this_01);
    dVar2 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar2,"gen color attachment rb",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                    ,0xbaf);
    glu::CallLogWrapper::glBindFramebuffer
              (&glLog,0x8d40,
               ((fbo.
                 super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                 .m_data.ptr)->super_ObjectWrapper).m_object);
    glu::CallLogWrapper::glFramebufferRenderbuffer
              (&glLog,0x8d40,0x8ce0,0x8d41,
               ((colorAttachment.
                 super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                 .m_data.ptr)->super_ObjectWrapper).m_object);
    lVar5 = (**(code **)(*(long *)this_01 + 0x18))(this_01);
    dVar2 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar2,"set fbo color attachment",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                    ,0xbb3);
    RVar8 = this->m_renderTarget ^ RENDERTARGET_FBO;
    if (RVar8 == RENDERTARGET_DEFAULT && this->m_type == TESTTYPE_DEPTH) {
      glu::CallLogWrapper::glBindRenderbuffer
                (&glLog,0x8d41,
                 ((testAttachment.
                   super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                   .m_data.ptr)->super_ObjectWrapper).m_object);
      glu::CallLogWrapper::glRenderbufferStorage(&glLog,0x8d41,0x81a5,0x20,0x20);
      lVar5 = (**(code **)(*(long *)this_01 + 0x18))(this_01);
      dVar2 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar2,"gen depth attachment rb",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                      ,0xbb9);
      glu::CallLogWrapper::glFramebufferRenderbuffer
                (&glLog,0x8d40,0x8d00,0x8d41,
                 ((testAttachment.
                   super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                   .m_data.ptr)->super_ObjectWrapper).m_object);
      lVar5 = (**(code **)(*(long *)this_01 + 0x18))(this_01);
      dVar2 = (**(code **)(lVar5 + 0x800))();
      iVar9 = 0xbbc;
      pcVar11 = "set fbo depth attachment";
LAB_01259172:
      glu::checkError(dVar2,pcVar11,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                      ,iVar9);
    }
    else if (RVar8 == RENDERTARGET_DEFAULT && this->m_type == TESTTYPE_STENCIL) {
      glu::CallLogWrapper::glBindRenderbuffer
                (&glLog,0x8d41,
                 ((testAttachment.
                   super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                   .m_data.ptr)->super_ObjectWrapper).m_object);
      glu::CallLogWrapper::glRenderbufferStorage(&glLog,0x8d41,0x8d48,0x20,0x20);
      lVar5 = (**(code **)(*(long *)this_01 + 0x18))(this_01);
      dVar2 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar2,"gen stencil attachment rb",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                      ,0xbc2);
      glu::CallLogWrapper::glFramebufferRenderbuffer
                (&glLog,0x8d40,0x8d20,0x8d41,
                 ((testAttachment.
                   super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                   .m_data.ptr)->super_ObjectWrapper).m_object);
      lVar5 = (**(code **)(*(long *)this_01 + 0x18))(this_01);
      dVar2 = (**(code **)(lVar5 + 0x800))();
      iVar9 = 0xbc5;
      pcVar11 = "set fbo stencil attachment";
      goto LAB_01259172;
    }
    glu::CallLogWrapper::glFramebufferRenderbuffer
              (&glLog,0x8d40,0x8ce0,0x8d41,
               ((colorAttachment.
                 super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                 .m_data.ptr)->super_ObjectWrapper).m_object);
    lVar5 = (**(code **)(*(long *)this_01 + 0x18))(this_01);
    dVar2 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar2,"setup fbo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                    ,0xbc9);
    GVar3 = glu::CallLogWrapper::glCheckFramebufferStatus(&glLog,0x8d40);
    if (GVar3 != 0x8cd5) {
      this_03 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_03,(char *)0x0,
                 "glLog.glCheckFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                 ,0xbca);
      __cxa_throw(this_03,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  glu::CallLogWrapper::glClearColor(&glLog,0.0,0.0,0.0,1.0);
  glu::CallLogWrapper::glClear(&glLog,0x4000);
  if (this->m_type == TESTTYPE_STENCIL) {
    glu::CallLogWrapper::glClearStencil(&glLog,0);
    glu::CallLogWrapper::glClear(&glLog,0x400);
    glu::CallLogWrapper::glScissor(&glLog,local_478,local_47c,0x10,0x20);
    glu::CallLogWrapper::glEnable(&glLog,0xc11);
    glu::CallLogWrapper::glClearStencil(&glLog,1);
    glu::CallLogWrapper::glClear(&glLog,0x400);
    glu::CallLogWrapper::glDisable(&glLog,0xc11);
    glu::CallLogWrapper::glStencilFunc(&glLog,0x202,1,1);
    GVar3 = 0xb90;
    glu::CallLogWrapper::glStencilOp(&glLog,0x1e00,0x1e00,0x1e00);
  }
  else {
    if (this->m_type != TESTTYPE_DEPTH) goto LAB_012592d6;
    glu::CallLogWrapper::glClearDepthf(&glLog,0.5);
    GVar3 = 0xb71;
    glu::CallLogWrapper::glClear(&glLog,0x100);
  }
  glu::CallLogWrapper::glEnable(&glLog,GVar3);
LAB_012592d6:
  type.super_ApiType.m_bits = (ApiType)(**(code **)(*(long *)this_01 + 0x10))(this_01);
  version = glu::getContextTypeGLSLVersion(type);
  pcVar11 = glu::getGLSLVersionDeclaration(version);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&glslVersionDeclaration,pcVar11,(allocator<char> *)&src);
  memset(attrBindings,0,0xac);
  std::operator+(&local_400,&glslVersionDeclaration,
                 "\n\nhighp in vec3 a_position;\n\nvoid main (void)\n{\n\tgl_Position = vec4(a_position, 1.0);\n}\n"
                );
  glu::VertexSource::VertexSource((VertexSource *)&uniforms,&local_400);
  pPVar7 = glu::ProgramSources::operator<<((ProgramSources *)attrBindings,(ShaderSource *)&uniforms)
  ;
  std::operator+(&local_328,&glslVersionDeclaration,"\n");
  imageAtomicExtensionShaderRequires_abi_cxx11_(&local_348,this_01,renderContext);
  std::operator+(&local_308,&local_328,&local_348);
  std::operator+(&local_2e8,&local_308,"\n");
  pcVar11 = glcts::fixed_sample_locations_values + 1;
  if (this->m_useEarlyTests != false) {
    pcVar11 = "layout (early_fragment_tests) in;\n\n";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_368,pcVar11,&local_471);
  std::operator+(&local_2c8,&local_2e8,&local_368);
  std::operator+(&local_2a8,&local_2c8,
                 "layout (location = 0) out highp vec4 o_color;\n\nprecision highp uimage2D;\n\nlayout (r32ui, binding=0) coherent uniform uimage2D u_image;\n\nvoid main (void)\n{\n\timageAtomicAdd(u_image, ivec2(0, 0), uint(1));\n\to_color = vec4(1.0);\n}\n"
                );
  glu::FragmentSource::FragmentSource((FragmentSource *)&rendered,&local_2a8);
  pPVar7 = glu::ProgramSources::operator<<(pPVar7,(ShaderSource *)&rendered);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)&src,(RenderContext *)this_01,pPVar7);
  std::__cxx11::string::~string((string *)&rendered.m_pixels);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&uniforms.m_log);
  std::__cxx11::string::~string((string *)&local_400);
  glu::ProgramSources::~ProgramSources((ProgramSources *)attrBindings);
  uniforms.m_gl = (Functions *)(**(code **)(*(long *)this_01 + 0x18))(this_01);
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header;
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uniforms.m_log = log;
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  glu::operator<<(log,(ShaderProgram *)&src);
  if (local_1c8 == false) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Program compilation failed");
  }
  else {
    glu::CallLogWrapper::glUseProgram(&glLog,local_1f0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&rendered,"a_position",(allocator<char> *)&local_400);
    glu::va::Float(attrBindings,(string *)&rendered,3,4,0,iterate::vertexPositions);
    std::__cxx11::string::~string((string *)&rendered);
    glu::CallLogWrapper::glViewport(&glLog,local_478,local_47c,0x20,0x20);
    rendered.m_width = 0;
    rendered.m_height = 6;
    rendered.m_pixels.m_ptr._0_4_ = 1;
    rendered.m_pixels.m_cap = (size_t)iterate::indices;
    glu::draw((RenderContext *)this_01,local_1f0,1,attrBindings,(PrimitiveList *)&rendered,
              (DrawUtilCallback *)0x0);
    lVar5 = (**(code **)(*(long *)this_01 + 0x18))(this_01);
    dVar2 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar2,"Draw failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                    ,0xc2b);
    std::__cxx11::string::~string((string *)&attrBindings[0].binding.name);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&uniforms.m_uniformLocations._M_t);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)&src);
  std::__cxx11::string::~string((string *)&glslVersionDeclaration);
  if (local_1c8 != false) {
    tcu::Surface::Surface(&rendered,0x20,0x20);
    tcu::Surface::getAccess((PixelBufferAccess *)&src,&rendered);
    glu::readPixels((RenderContext *)this_01,local_478,local_47c,(PixelBufferAccess *)&src);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)attrBindings,"Rendered",(allocator<char> *)&glslVersionDeclaration);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&uniforms,"Rendered image",(allocator<char> *)&local_400);
    surface = &rendered;
    tcu::LogImage::LogImage
              ((LogImage *)&src,(string *)attrBindings,(string *)&uniforms,surface,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&src,(int)log,__buf,(size_t)surface);
    tcu::LogImage::~LogImage((LogImage *)&src);
    std::__cxx11::string::~string((string *)&uniforms);
    std::__cxx11::string::~string((string *)attrBindings);
    tcu::Surface::~Surface(&rendered);
    lVar5 = (**(code **)(*(long *)this_01 + 0x20))(this_01);
    iVar9 = 1;
    if (1 < *(int *)(lVar5 + 0x20)) {
      iVar9 = *(int *)(lVar5 + 0x20);
    }
    bVar12 = (RVar1 != RENDERTARGET_FBO_WITHOUT_TEST_ATTACHMENT & bVar12) == 0;
    src.m_size.m_data[1] = 0x1a0;
    if (bVar12) {
      src.m_size.m_data[1] = 0x400;
    }
    iVar10 = 0x260;
    if (bVar12) {
      iVar10 = 0x400;
    }
    src.m_size.m_data[2] = iVar10 * iVar9;
    uniforms.m_gl = (Functions *)0x2100000000;
    attrBindings[0].binding._0_8_ = &DAT_100000001;
    attrBindings[0].binding.name._M_dataplus._M_p._0_4_ = 1;
    src._0_8_ = &PTR_operator___01e4b4d0;
    bVar12 = readIntegerTextureViaFBOAndVerify
                       ((RenderContext *)this_01,&glLog,texture.super_ObjectWrapper.m_object,
                        TEXTURETYPE_2D,(TextureFormat *)&uniforms,(IVec3 *)attrBindings,
                        (ImageLayerVerifier *)&src);
    pcVar11 = "Got wrong value";
    if (bVar12) {
      pcVar11 = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar12,pcVar11)
    ;
  }
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  ::~UniqueBase(&testAttachment.
                 super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
               );
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  ::~UniqueBase(&colorAttachment.
                 super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
               );
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  ::~UniqueBase(&fbo.
                 super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
               );
  glu::ObjectWrapper::~ObjectWrapper(&texture.super_ObjectWrapper);
  glu::CallLogWrapper::~CallLogWrapper(&glLog);
  return STOP;
}

Assistant:

EarlyFragmentTestsCase::IterateResult EarlyFragmentTestsCase::iterate (void)
{
	const RenderContext&			renderCtx			= m_context.getRenderContext();
	TestLog&						log					(m_testCtx.getLog());
	glu::CallLogWrapper				glLog				(renderCtx.getFunctions(), log);
	de::Random						rnd					(deStringHash(getName()));
	const bool						expectPartialResult	= m_useEarlyTests && m_renderTarget != RENDERTARGET_FBO_WITHOUT_TEST_ATTACHMENT;
	const int						viewportWidth		= RENDER_SIZE;
	const int						viewportHeight		= RENDER_SIZE;
	const int						viewportX			= (m_renderTarget == RENDERTARGET_DEFAULT) ? (rnd.getInt(0, renderCtx.getRenderTarget().getWidth() - viewportWidth))	: (0);
	const int						viewportY			= (m_renderTarget == RENDERTARGET_DEFAULT) ? (rnd.getInt(0, renderCtx.getRenderTarget().getHeight() - viewportHeight))	: (0);
	const glu::Texture				texture				(renderCtx);
	de::MovePtr<glu::Framebuffer>	fbo;
	de::MovePtr<glu::Renderbuffer>	colorAttachment;
	de::MovePtr<glu::Renderbuffer>	testAttachment;

	glLog.enableLogging(true);

	// Setup texture.

	log << TestLog::Message << "// Created a texture (name " << *texture << ")" << TestLog::EndMessage;

	glLog.glActiveTexture(GL_TEXTURE0);
	glLog.glBindTexture(GL_TEXTURE_2D, *texture);
	setTexParameteri(glLog, GL_TEXTURE_2D);
	{
		LayeredImage src(TEXTURETYPE_2D, TextureFormat(TextureFormat::R, TextureFormat::UNSIGNED_INT32), 1, 1, 1);
		src.setPixel(0, 0, 0, IVec4(0));
		uploadTexture(glLog, src, 0 /* always 2d texture, no buffer needed */);
	}
	glLog.glBindImageTexture(0, *texture, 0, GL_TRUE, 0, GL_READ_WRITE, GL_R32UI);
	GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");

	// Set up framebuffer
	if (m_renderTarget == RENDERTARGET_FBO ||
		m_renderTarget == RENDERTARGET_FBO_WITHOUT_TEST_ATTACHMENT)
	{
		fbo				= de::MovePtr<glu::Framebuffer>(new glu::Framebuffer(renderCtx));
		colorAttachment	= de::MovePtr<glu::Renderbuffer>(new glu::Renderbuffer(renderCtx));
		testAttachment	= de::MovePtr<glu::Renderbuffer>(new glu::Renderbuffer(renderCtx));

		glLog.glBindRenderbuffer(GL_RENDERBUFFER, **colorAttachment);
		glLog.glRenderbufferStorage(GL_RENDERBUFFER, GL_RGBA8, RENDER_SIZE, RENDER_SIZE);
		GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "gen color attachment rb");

		glLog.glBindFramebuffer(GL_FRAMEBUFFER, **fbo);
		glLog.glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, **colorAttachment);
		GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "set fbo color attachment");

		if (m_renderTarget == RENDERTARGET_FBO && m_type == TESTTYPE_DEPTH)
		{
			glLog.glBindRenderbuffer(GL_RENDERBUFFER, **testAttachment);
			glLog.glRenderbufferStorage(GL_RENDERBUFFER, GL_DEPTH_COMPONENT16, RENDER_SIZE, RENDER_SIZE);
			GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "gen depth attachment rb");

			glLog.glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, **testAttachment);
			GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "set fbo depth attachment");
		}
		else if (m_renderTarget == RENDERTARGET_FBO && m_type == TESTTYPE_STENCIL)
		{
			glLog.glBindRenderbuffer(GL_RENDERBUFFER, **testAttachment);
			glLog.glRenderbufferStorage(GL_RENDERBUFFER, GL_STENCIL_INDEX8, RENDER_SIZE, RENDER_SIZE);
			GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "gen stencil attachment rb");

			glLog.glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER, **testAttachment);
			GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "set fbo stencil attachment");
		}

		glLog.glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, **colorAttachment);
		GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "setup fbo");
		TCU_CHECK(glLog.glCheckFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE);
	}

	// Set up appropriate conditions for the test.

	glLog.glClearColor(0.0f, 0.0f, 0.0f, 1.0f);
	glLog.glClear(GL_COLOR_BUFFER_BIT);

	if (m_type == TESTTYPE_DEPTH)
	{
		glLog.glClearDepthf(0.5f);
		glLog.glClear(GL_DEPTH_BUFFER_BIT);
		glLog.glEnable(GL_DEPTH_TEST);
	}
	else if (m_type == TESTTYPE_STENCIL)
	{
		glLog.glClearStencil(0);
		glLog.glClear(GL_STENCIL_BUFFER_BIT);
		glLog.glScissor(viewportX, viewportY, viewportWidth/2, viewportHeight);
		glLog.glEnable(GL_SCISSOR_TEST);
		glLog.glClearStencil(1);
		glLog.glClear(GL_STENCIL_BUFFER_BIT);
		glLog.glDisable(GL_SCISSOR_TEST);
		glLog.glStencilFunc(GL_EQUAL, 1, 1);
		glLog.glStencilOp(GL_KEEP, GL_KEEP, GL_KEEP);
		glLog.glEnable(GL_STENCIL_TEST);
	}
	else
		DE_ASSERT(false);

	// Perform image stores in fragment shader.

	{
		const std::string glslVersionDeclaration = glu::getGLSLVersionDeclaration(glu::getContextTypeGLSLVersion(renderCtx.getType()));

		// Generate fragment shader.

		const glu::ShaderProgram program(renderCtx,
			glu::ProgramSources() << glu::VertexSource(		glslVersionDeclaration + "\n"
															"\n"
															"highp in vec3 a_position;\n"
															"\n"
															"void main (void)\n"
															"{\n"
															"	gl_Position = vec4(a_position, 1.0);\n"
															"}\n")

								  << glu::FragmentSource(	glslVersionDeclaration + "\n"
															+ imageAtomicExtensionShaderRequires(renderCtx) +
															"\n"
															+ string(m_useEarlyTests ? "layout (early_fragment_tests) in;\n\n" : "") +
															"layout (location = 0) out highp vec4 o_color;\n"
															"\n"
															"precision highp uimage2D;\n"
															"\n"
															"layout (r32ui, binding=0) coherent uniform uimage2D u_image;\n"
															"\n"
															"void main (void)\n"
															"{\n"
															"	imageAtomicAdd(u_image, ivec2(0, 0), uint(1));\n"
															"	o_color = vec4(1.0);\n"
															"}\n"));

		UniformAccessLogger uniforms(renderCtx.getFunctions(), log, program.getProgram());

		log << program;

		if (!program.isOk())
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Program compilation failed");
			return STOP;
		}

		// Setup and draw full-viewport quad.

		glLog.glUseProgram(program.getProgram());

		{
			static const float vertexPositions[4*3] =
			{
				-1.0, -1.0, -1.0f,
				 1.0, -1.0,  0.0f,
				-1.0,  1.0,  0.0f,
				 1.0,  1.0,  1.0f,
			};

			static const deUint16 indices[6] = { 0, 1, 2, 2, 1, 3 };

			const glu::VertexArrayBinding attrBindings[] =
			{
				glu::va::Float("a_position", 3, 4, 0, &vertexPositions[0])
			};

			glLog.glViewport(viewportX, viewportY, viewportWidth, viewportHeight);

			glu::draw(renderCtx, program.getProgram(), DE_LENGTH_OF_ARRAY(attrBindings), &attrBindings[0],
				glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));
			GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "Draw failed");
		}
	}

	// Log rendered result for convenience.
	{
		tcu::Surface rendered(viewportWidth, viewportHeight);
		glu::readPixels(renderCtx, viewportX, viewportY, rendered.getAccess());
		log << TestLog::Image("Rendered", "Rendered image", rendered);
	}

	// Read counter value and check.
	{
		const int numSamples		= de::max(1, renderCtx.getRenderTarget().getNumSamples());
		const int expectedCounter	= expectPartialResult ? viewportWidth*viewportHeight/2				: viewportWidth*viewportHeight;
		const int tolerance			= expectPartialResult ? de::max(viewportWidth, viewportHeight)*3	: 0;
		const int expectedMin		= de::max(0, expectedCounter - tolerance);
		const int expectedMax		= (expectedCounter + tolerance) * numSamples;

		if (readIntegerTextureViaFBOAndVerify(renderCtx, glLog, *texture, TEXTURETYPE_2D, TextureFormat(TextureFormat::R, TextureFormat::UNSIGNED_INT32),
											  IVec3(1, 1, 1), R32UIImageSingleValueVerifier(expectedMin, expectedMax)))
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got wrong value");

		return STOP;
	}
}